

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-set-fchmod.c
# Opt level: O3

int run_test_pipe_set_chmod(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uv_loop_t *puVar7;
  uv_pipe_t pipe_handle;
  stat stat_buf;
  undefined1 auStack_1a8 [288];
  uint local_88;
  
  puVar3 = (uv_loop_t *)auStack_1a8;
  pcVar4 = auStack_1a8;
  pcVar5 = auStack_1a8;
  pcVar6 = auStack_1a8;
  puVar7 = (uv_loop_t *)auStack_1a8;
  puVar2 = (uv_loop_t *)auStack_1a8;
  loop = uv_default_loop();
  iVar1 = uv_pipe_init(loop,(uv_pipe_t *)auStack_1a8,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind((uv_pipe_t *)auStack_1a8,"/tmp/uv-test-sock");
    loop = puVar3;
    if (iVar1 != 0) goto LAB_00163c05;
    iVar1 = uv_pipe_chmod((uv_pipe_t *)auStack_1a8,1);
    if (iVar1 != 0) {
      if (iVar1 != -1) goto LAB_00163c0a;
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      puVar2 = _stderr;
      if (iVar1 == 0) {
        run_test_pipe_set_chmod_cold_22();
        return 1;
      }
      goto LAB_00163c5f;
    }
    pcVar4 = "/tmp/uv-test-sock";
    stat64("/tmp/uv-test-sock",(stat64 *)(auStack_1a8 + 0x108));
    if ((local_88 >> 8 & 1) == 0) goto LAB_00163c0f;
    if ((local_88 & 0x20) == 0) goto LAB_00163c14;
    if ((local_88 & 4) == 0) goto LAB_00163c19;
    iVar1 = uv_pipe_chmod((uv_pipe_t *)auStack_1a8,2);
    if (iVar1 != 0) goto LAB_00163c1e;
    pcVar5 = "/tmp/uv-test-sock";
    stat64("/tmp/uv-test-sock",(stat64 *)(auStack_1a8 + 0x108));
    if (-1 < (char)local_88) goto LAB_00163c23;
    if ((local_88 & 0x10) == 0) goto LAB_00163c28;
    if ((local_88 & 2) == 0) goto LAB_00163c2d;
    iVar1 = uv_pipe_chmod((uv_pipe_t *)auStack_1a8,3);
    if (iVar1 != 0) goto LAB_00163c32;
    pcVar6 = "/tmp/uv-test-sock";
    stat64("/tmp/uv-test-sock",(stat64 *)(auStack_1a8 + 0x108));
    if ((local_88 >> 8 & 1) == 0) goto LAB_00163c37;
    if ((local_88 & 0x20) == 0) goto LAB_00163c3c;
    if ((local_88 & 4) == 0) goto LAB_00163c41;
    if (-1 < (char)local_88) goto LAB_00163c46;
    if ((local_88 & 0x10) == 0) goto LAB_00163c4b;
    if ((local_88 & 2) == 0) goto LAB_00163c50;
    pcVar6 = (char *)0x0;
    iVar1 = uv_pipe_chmod((uv_pipe_t *)0x0,3);
    if (iVar1 != -9) goto LAB_00163c55;
    iVar1 = uv_pipe_chmod((uv_pipe_t *)auStack_1a8,0xbc614e);
    if (iVar1 != -0x16) goto LAB_00163c5a;
    uv_close((uv_handle_t *)auStack_1a8,(uv_close_cb)0x0);
    iVar1 = uv_pipe_chmod((uv_pipe_t *)auStack_1a8,3);
    if (iVar1 == -9) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163c69;
    }
  }
  else {
    run_test_pipe_set_chmod_cold_1();
LAB_00163c05:
    pcVar4 = (char *)loop;
    run_test_pipe_set_chmod_cold_2();
LAB_00163c0a:
    run_test_pipe_set_chmod_cold_23();
LAB_00163c0f:
    run_test_pipe_set_chmod_cold_20();
LAB_00163c14:
    run_test_pipe_set_chmod_cold_19();
LAB_00163c19:
    pcVar5 = pcVar4;
    run_test_pipe_set_chmod_cold_18();
LAB_00163c1e:
    run_test_pipe_set_chmod_cold_3();
LAB_00163c23:
    run_test_pipe_set_chmod_cold_17();
LAB_00163c28:
    run_test_pipe_set_chmod_cold_16();
LAB_00163c2d:
    pcVar6 = pcVar5;
    run_test_pipe_set_chmod_cold_15();
LAB_00163c32:
    run_test_pipe_set_chmod_cold_4();
LAB_00163c37:
    run_test_pipe_set_chmod_cold_14();
LAB_00163c3c:
    run_test_pipe_set_chmod_cold_13();
LAB_00163c41:
    run_test_pipe_set_chmod_cold_12();
LAB_00163c46:
    run_test_pipe_set_chmod_cold_11();
LAB_00163c4b:
    run_test_pipe_set_chmod_cold_10();
LAB_00163c50:
    run_test_pipe_set_chmod_cold_9();
LAB_00163c55:
    puVar7 = (uv_loop_t *)pcVar6;
    run_test_pipe_set_chmod_cold_5();
LAB_00163c5a:
    run_test_pipe_set_chmod_cold_6();
    puVar2 = puVar7;
LAB_00163c5f:
    run_test_pipe_set_chmod_cold_21();
  }
  run_test_pipe_set_chmod_cold_7();
LAB_00163c69:
  run_test_pipe_set_chmod_cold_8();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_set_chmod) {
  uv_pipe_t pipe_handle;
  uv_loop_t* loop;
  int r;
#ifndef _WIN32
  struct stat stat_buf;
#endif

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &pipe_handle, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&pipe_handle, TEST_PIPENAME);
  ASSERT(r == 0);

  /* No easy way to test if this works, we will only make sure that the call is
   * successful. */
  r = uv_pipe_chmod(&pipe_handle, UV_READABLE);
  if (r == UV_EPERM) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("Insufficient privileges to alter pipe fmode");
  }
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE);
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT(r == 0);
#ifndef _WIN32
  stat(TEST_PIPENAME, &stat_buf);
  ASSERT(stat_buf.st_mode & S_IRUSR);
  ASSERT(stat_buf.st_mode & S_IRGRP);
  ASSERT(stat_buf.st_mode & S_IROTH);
  ASSERT(stat_buf.st_mode & S_IWUSR);
  ASSERT(stat_buf.st_mode & S_IWGRP);
  ASSERT(stat_buf.st_mode & S_IWOTH);
#endif

  r = uv_pipe_chmod(NULL, UV_WRITABLE | UV_READABLE);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_chmod(&pipe_handle, 12345678);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&pipe_handle, NULL);
  r = uv_pipe_chmod(&pipe_handle, UV_WRITABLE | UV_READABLE);
  ASSERT(r == UV_EBADF);

  MAKE_VALGRIND_HAPPY();
  return 0;
}